

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O2

Error __thiscall
asmjit::X86FuncArgsContext::markRegsForSwaps(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  uint uVar1;
  uint32_t i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  if (this->_hasRegSwaps != true) {
    return 0;
  }
  lVar2 = 0;
  do {
    if (lVar2 != 0) {
      if (lVar2 == 4) {
        return 0;
      }
      if (this->_workData[0].numSwaps != '\0') {
        uVar3 = this->_workData[0].usedRegs;
        uVar1 = this->_workData[0].workRegs;
        uVar4 = ~(this->_workData[0].dstRegs | uVar3) & uVar1;
        uVar3 = ~uVar3 & uVar1;
        if (uVar4 != 0) {
          uVar3 = uVar4;
        }
        if ((uVar3 != 0) || (uVar3 = ~uVar1 & this->_workData[0].archRegs, uVar3 != 0)) {
          this->_workData[0].workRegs = uVar1 | -uVar3 & uVar3;
          ffi->_dirtyRegs[lVar2] = ffi->_dirtyRegs[lVar2] | -uVar3 & uVar3;
        }
      }
    }
    lVar2 = lVar2 + 1;
    this = (X86FuncArgsContext *)(this->_workData + 1);
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markRegsForSwaps(FuncFrameInfo& ffi) noexcept {
  if (!_hasRegSwaps)
    return kErrorOk;

  // If some registers require swapping then select one dirty register that
  // can be used as a temporary. We can do it also without it (by using xors),
  // but using temporary is always safer and also faster approach.
  for (uint32_t i = 0; i < kMaxVRegKinds; i++) {
    // Skip all register kinds where swapping is natively supported (GP regs).
    if (i == X86Reg::kKindGp) continue;

    // Skip all register kinds that don't require swapping.
    WorkData& wd = _workData[i];
    if (!wd.numSwaps) continue;

    // Initially, pick some clobbered or dirty register.
    uint32_t workRegs = wd.workRegs;
    uint32_t regs = workRegs & ~(wd.usedRegs | wd.dstRegs);

    // If that didn't work out pick some register which is not in 'used'.
    if (!regs) regs = workRegs & ~wd.usedRegs;

    // If that didn't work out pick any other register that is allocable.
    // This last resort case will, however, result in marking one more
    // register dirty.
    if (!regs) regs = wd.archRegs & ~workRegs;

    // If that didn't work out we will have to use xors instead of moves.
    if (!regs) continue;

    uint32_t regMask = Utils::mask(Utils::findFirstBit(regs));
    wd.workRegs |= regMask;
    ffi.addDirtyRegs(i, regMask);
  }

  return kErrorOk;
}